

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterMapFile(SortSubtask *pTask,SorterFile *pFile,u8 **pp)

{
  sqlite3_file *pFd;
  int rc;
  u8 **pp_local;
  SorterFile *pFile_local;
  SortSubtask *pTask_local;
  
  pFd._4_4_ = 0;
  if ((pFile->iEof <= (long)pTask->pSorter->db->nMaxSorterMmap) &&
     (2 < pFile->pFd->pMethods->iVersion)) {
    pFd._4_4_ = sqlite3OsFetch(pFile->pFd,0,(int)pFile->iEof,pp);
  }
  return pFd._4_4_;
}

Assistant:

static int vdbeSorterMapFile(SortSubtask *pTask, SorterFile *pFile, u8 **pp){
  int rc = SQLITE_OK;
  if( pFile->iEof<=(i64)(pTask->pSorter->db->nMaxSorterMmap) ){
    sqlite3_file *pFd = pFile->pFd;
    if( pFd->pMethods->iVersion>=3 ){
      rc = sqlite3OsFetch(pFd, 0, (int)pFile->iEof, (void**)pp);
      testcase( rc!=SQLITE_OK );
    }
  }
  return rc;
}